

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphic.cpp
# Opt level: O3

int main(void)

{
  int iVar1;
  convertable *pcVar2;
  graphic g;
  value<int> m;
  undefined4 local_5c;
  convertable *local_58;
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  undefined **local_40 [2];
  long *local_30;
  convertable local_28;
  undefined4 local_20;
  
  mtrace();
  mpt::graphic::graphic((graphic *)local_40);
  mpt::array::array((array *)&local_30,0);
  local_40[0] = &PTR__graphic_00104c60;
  pcVar2 = (convertable *)mpt::graphic::create_layout();
  local_28._vptr_convertable = (_func_int **)&PTR_convert_00104d18;
  local_20 = 0;
  mpt::logger::default_instance();
  mpt::object::set((char *)(pcVar2 + 3),"name",(logger *)"lay");
  iVar1 = mpt::graphic::add_layout((layout *)local_40,SUB81(pcVar2,0));
  mpt::graphic::hint::hint((hint *)&local_44,iVar1,4,3);
  local_5c = local_44;
  local_58 = pcVar2;
  mpt::updates<const_mpt::convertable_*,_mpt::graphic::hint>::add
            ((updates<const_mpt::convertable_*,_mpt::graphic::hint> *)&local_30,&local_58,
             (hint *)&local_5c);
  mpt::graphic::hint::hint((hint *)&local_48,iVar1,6,8);
  local_5c = local_48;
  local_58 = pcVar2;
  mpt::updates<const_mpt::convertable_*,_mpt::graphic::hint>::add
            ((updates<const_mpt::convertable_*,_mpt::graphic::hint> *)&local_30,&local_58,
             (hint *)&local_5c);
  mpt::graphic::hint::hint((hint *)&local_4c,iVar1,4,-1);
  local_5c = local_4c;
  local_58 = pcVar2;
  mpt::updates<const_mpt::convertable_*,_mpt::graphic::hint>::add
            ((updates<const_mpt::convertable_*,_mpt::graphic::hint> *)&local_30,&local_58,
             (hint *)&local_5c);
  mpt::graphic::hint::hint((hint *)&local_50,iVar1,4,-1);
  local_5c = local_50;
  local_58 = &local_28;
  mpt::updates<const_mpt::convertable_*,_mpt::graphic::hint>::add
            ((updates<const_mpt::convertable_*,_mpt::graphic::hint> *)&local_30,&local_58,
             (hint *)&local_5c);
  graphic::dispatch_updates((graphic *)local_40);
  mpt::updates<const_mpt::convertable_*,_mpt::graphic::hint>::compress
            ((updates<const_mpt::convertable_*,_mpt::graphic::hint> *)&local_30,0);
  mpt::graphic::remove_layout((layout *)local_40);
  if (local_30 != (long *)0x0) {
    (**(code **)(*local_30 + 8))();
  }
  mpt::graphic::~graphic((graphic *)local_40);
  return 0;
}

Assistant:

int main()
{
	mtrace();
	
	graphic g;
	
	mpt::layout *l = g.create_layout();
	mpt::metatype::value<int> m(0);
	
	l->set("name", "lay");
	
	int pos = g.add_layout(l);
	g.register_update(l,  mpt::graphic::hint(pos, 4, 3));
	g.register_update(l,  mpt::graphic::hint(pos, 6, 8)); // unique hint
	g.register_update(l,  mpt::graphic::hint(pos, 4));    // overrides specific entry
	g.register_update(&m, mpt::graphic::hint(pos, 4));    // different data value
	
	g.dispatch_updates();
	g.compress();
	
	g.remove_layout(l);
}